

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  ulong *puVar1;
  U32 *pUVar2;
  uint uVar3;
  ulong *ip;
  rawSeq *prVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  U32 UVar8;
  ulong uVar9;
  size_t sVar10;
  BYTE *pBVar11;
  xxh_u64 xVar12;
  ulong *puVar13;
  byte bVar14;
  byte bVar15;
  U32 UVar16;
  ulong *puVar17;
  ulong uVar18;
  U32 maxDist;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  BYTE *pBVar23;
  ulong uVar24;
  U32 UVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *src_00;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  ulong *puVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ldmEntry_t *plVar35;
  BYTE *pBVar36;
  ldmEntry_t *plVar37;
  ldmRollingHashState_t hashState;
  uint local_1ec;
  BYTE *local_1d0;
  uint local_194;
  BYTE *local_190;
  size_t local_188;
  ulong *local_180;
  ldmMatchCandidate_t *local_178;
  ldmEntry_t *local_170;
  ulong local_168;
  uint local_160;
  uint local_15c;
  long local_158;
  ulong local_150;
  long local_148;
  rawSeqStore_t *local_140;
  BYTE *local_138;
  BYTE *local_130;
  size_t *local_128;
  long local_120;
  size_t local_118;
  ulong local_110;
  ldmEntry_t *local_108;
  ulong local_100;
  ulong local_f8;
  BYTE *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong *local_d8;
  void *local_d0;
  size_t local_c8;
  BYTE *local_c0;
  ulong local_b8;
  BYTE *local_b0;
  ulong *local_a8;
  BYTE *local_a0;
  BYTE *local_98;
  long local_90;
  ulong *local_88;
  ulong local_80;
  BYTE *local_78;
  ulong *local_70;
  ulong *local_68;
  ulong local_60;
  BYTE *local_58;
  BYTE *local_50;
  BYTE *local_48;
  ldmRollingHashState_t local_40;
  
  maxDist = 1 << ((byte)params->windowLog & 0x1f);
  local_d8 = (ulong *)((long)src + srcSize);
  local_158 = ((srcSize >> 0x14) + 1) - (ulong)((srcSize & 0xfffff) == 0);
  local_d0 = src;
  local_c8 = srcSize;
  if ((ldmState->window).nextSrc < local_d8) {
    __assert_fail("ldmState->window.nextSrc >= (BYTE const*)src + srcSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7e57,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  uVar22 = sequences->size;
  if (uVar22 < sequences->pos) {
    __assert_fail("sequences->pos <= sequences->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7e5b,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (sequences->capacity < uVar22) {
    __assert_fail("sequences->size <= sequences->capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7e5c,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (local_158 != 0) {
    local_128 = ldmState->splitIndices;
    local_178 = ldmState->matchCandidates;
    local_148 = 0;
    uVar9 = 0;
    do {
      if (sequences->capacity <= uVar22) {
        return 0;
      }
      src_00 = (ulong *)((long)local_d0 + local_148 * 0x100000);
      puVar17 = src_00 + 0x20000;
      if (local_c8 + local_148 * -0x100000 < 0x100000) {
        puVar17 = local_d8;
      }
      local_150 = uVar9;
      local_b8 = uVar22;
      if ((long)local_c8 <= local_148 * 0x100000) {
        __assert_fail("chunkStart < iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7e66,
                      "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                     );
      }
      local_1d0 = (ldmState->window).base;
      uVar7 = (int)puVar17 - (int)local_1d0;
      if (uVar7 < 0xe0000001) {
        UVar16 = ldmState->loadedDictEnd;
      }
      else {
        UVar16 = params->hashLog;
        UVar8 = ZSTD_window_correctOverflow(&ldmState->window,0,maxDist,src_00);
        plVar35 = ldmState->hashTable;
        lVar29 = 0;
        do {
          uVar7 = plVar35[lVar29].offset;
          UVar25 = uVar7 - UVar8;
          if (uVar7 < UVar8) {
            UVar25 = 0;
          }
          plVar35[lVar29].offset = UVar25;
          lVar29 = lVar29 + 1;
        } while (1L << ((byte)UVar16 & 0x3f) != lVar29);
        ldmState->loadedDictEnd = 0;
        local_1d0 = (ldmState->window).base;
        uVar7 = (int)puVar17 - (int)local_1d0;
        UVar16 = 0;
      }
      local_1ec = (ldmState->window).lowLimit;
      if (UVar16 + maxDist < uVar7) {
        uVar7 = uVar7 - maxDist;
        if (local_1ec < uVar7) {
          (ldmState->window).lowLimit = uVar7;
          local_1ec = uVar7;
        }
        local_160 = (ldmState->window).dictLimit;
        if (local_160 < local_1ec) {
          (ldmState->window).dictLimit = local_1ec;
          local_160 = local_1ec;
        }
        ldmState->loadedDictEnd = 0;
      }
      else {
        local_160 = (ldmState->window).dictLimit;
      }
      bVar14 = (byte)params->bucketSizeLog;
      local_90 = 1L << (bVar14 & 0x3f);
      uVar7 = params->minMatchLength;
      if (local_1ec < local_160) {
        pBVar36 = (ldmState->window).dictBase;
        uVar32 = local_1ec;
      }
      else {
        pBVar36 = (BYTE *)0x0;
        uVar32 = local_160;
      }
      uVar9 = (long)puVar17 - (long)src_00;
      local_78 = pBVar36 + uVar32;
      local_48 = pBVar36 + local_160;
      local_130 = (BYTE *)0x0;
      if (local_1ec < local_160) {
        local_130 = local_78;
      }
      local_138 = (BYTE *)0x0;
      if (local_1ec < local_160) {
        local_138 = local_48;
      }
      uVar22 = (ulong)uVar7;
      uVar18 = uVar9;
      if (uVar22 <= uVar9) {
        pBVar23 = (BYTE *)((long)src_00 + (uVar9 - 8));
        uVar28 = 0x40;
        if (uVar7 < 0x40) {
          uVar28 = uVar7;
        }
        bVar15 = (byte)params->hashRateLog;
        local_40.rolling = 0xffffffff;
        bVar6 = (char)uVar28 - bVar15;
        if (uVar28 <= params->hashRateLog - 1) {
          bVar6 = 0;
        }
        local_40.stopMask = ~(-1L << (bVar15 & 0x3f)) << (bVar6 & 0x3f);
        pBVar11 = (BYTE *)((long)src_00 + uVar22);
        local_50 = pBVar36;
        if (pBVar11 < pBVar23) {
          pBVar36 = local_1d0 + local_160;
          local_58 = (BYTE *)((long)src_00 + uVar9);
          local_100 = -uVar22;
          local_15c = ~(-1 << ((char)params->hashLog - bVar14 & 0x1f));
          puVar1 = (ulong *)(local_58 + -7);
          local_68 = (ulong *)(local_58 + -3);
          local_70 = (ulong *)(local_58 + -1);
          local_98 = local_1d0 + 8;
          local_a0 = local_1d0 + -1;
          local_b0 = local_138 + -1;
          local_168 = uVar22;
          local_140 = sequences;
          local_e0 = uVar9;
          local_c0 = pBVar23;
          do {
            local_194 = 0;
            local_190 = pBVar11;
            sVar10 = ZSTD_ldm_gear_feed(&local_40,pBVar11,(long)local_c0 - (long)pBVar11,local_128,
                                        &local_194);
            local_f8 = (ulong)local_194;
            pBVar11 = local_190;
            if (local_f8 != 0) {
              uVar22 = 0;
              local_188 = sVar10;
              do {
                sVar10 = local_128[uVar22];
                pBVar23 = local_190 + local_100 + sVar10;
                lVar29 = 0x27d4eb2f165667c5;
                uVar9 = local_100;
                pBVar11 = pBVar23;
                if (0x1f < uVar7) {
                  lVar29 = 0x60ea27eeadc0b5d6;
                  uVar34 = 0xc2b2ae3d27d4eb4f;
                  uVar18 = 0;
                  uVar33 = 0x61c8864e7a143579;
                  do {
                    uVar26 = *(long *)(local_190 + uVar9 + sVar10) * -0x3d4d51c2d82b14b1 + lVar29;
                    uVar27 = uVar26 * 0x80000000 | uVar26 >> 0x21;
                    lVar29 = uVar27 * -0x61c8864e7a143579;
                    uVar34 = *(long *)(local_190 + uVar9 + sVar10 + 8) * -0x3d4d51c2d82b14b1 +
                             uVar34;
                    uVar20 = uVar34 * 0x80000000 | uVar34 >> 0x21;
                    uVar18 = *(long *)(local_190 + uVar9 + sVar10 + 0x10) * -0x3d4d51c2d82b14b1 +
                             uVar18;
                    uVar26 = uVar18 * 0x80000000 | uVar18 >> 0x21;
                    uVar34 = uVar20 * -0x61c8864e7a143579;
                    uVar18 = uVar26 * -0x61c8864e7a143579;
                    uVar33 = *(long *)(local_190 + uVar9 + sVar10 + 0x18) * -0x3d4d51c2d82b14b1 +
                             uVar33;
                    uVar30 = uVar33 * 0x80000000 | uVar33 >> 0x21;
                    uVar33 = uVar30 * -0x61c8864e7a143579;
                    uVar24 = uVar9 + 0x20;
                    bVar5 = (long)uVar9 < -0x3f;
                    uVar9 = uVar24;
                  } while (bVar5);
                  pBVar11 = local_190 + uVar24 + sVar10;
                  uVar9 = ((uVar26 * -0x784349ab80000000 | uVar26 * -0x210ca4fef0869357 >> 0x21) *
                           -0x61c8864e7a143579 ^
                          ((uVar20 * -0x784349ab80000000 | uVar20 * -0x210ca4fef0869357 >> 0x21) *
                           -0x61c8864e7a143579 ^
                          ((uVar27 * -0x784349ab80000000 | uVar27 * -0x210ca4fef0869357 >> 0x21) *
                           -0x61c8864e7a143579 ^
                          (uVar30 * -0x1939e850d5e40000 | uVar33 >> 0x2e) +
                          (uVar26 * 0x779b185ebca87000 | uVar18 >> 0x34) +
                          (uVar20 * 0x1bbcd8c2f5e54380 | uVar34 >> 0x39) +
                          (uVar27 * 0x3c6ef3630bd7950e | (ulong)(lVar29 < 0))) * -0x61c8864e7a143579
                          + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) *
                          -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
                  lVar29 = ((uVar30 * -0x784349ab80000000 | uVar30 * -0x210ca4fef0869357 >> 0x21) *
                            -0x61c8864e7a143579 ^ uVar9) * -0x61c8864e7a143579 + -0x7a1435883d4d519d
                  ;
                }
                xVar12 = XXH64_finalize(lVar29 + local_168,pBVar11,local_168,(XXH_alignment)uVar9);
                uVar28 = local_160;
                uVar19 = (uint)xVar12 & local_15c;
                local_178[uVar22].split = pBVar23;
                local_178[uVar22].hash = uVar19;
                local_178[uVar22].checksum = (U32)(xVar12 >> 0x20);
                local_178[uVar22].bucket =
                     ldmState->hashTable + ((ulong)uVar19 << ((byte)params->bucketSizeLog & 0x3f));
                uVar22 = uVar22 + 1;
              } while (uVar22 != local_f8);
              local_a8 = (ulong *)(local_190 + local_188);
              uVar22 = 0;
              do {
                ip = (ulong *)local_178[uVar22].split;
                uVar19 = local_178[uVar22].checksum;
                local_110 = (ulong)local_178[uVar22].hash;
                uVar9 = (long)ip - (long)local_1d0;
                local_60 = uVar22;
                if (ip < src_00) {
LAB_00172659:
                  bVar14 = (byte)params->bucketSizeLog;
                  pBVar23 = ldmState->bucketOffsets;
                  bVar6 = pBVar23[local_110];
                  ldmState->hashTable[(local_110 << (bVar14 & 0x3f)) + (ulong)bVar6] =
                       (ldmEntry_t)(uVar9 & 0xffffffff | (ulong)uVar19 << 0x20);
                  pBVar23[local_110] = ~(byte)(-1 << (bVar14 & 0x1f)) & bVar6 + 1;
                }
                else {
                  plVar37 = local_178[uVar22].bucket;
                  plVar35 = plVar37 + local_90;
                  local_88 = ip + 1;
                  local_180 = (ulong *)((long)ip + -1);
                  local_118 = 0;
                  local_120 = 0;
                  local_e8 = 0;
                  local_108 = (ldmEntry_t *)0x0;
                  local_170 = plVar35;
                  local_80 = (long)ip - (long)local_1d0;
                  do {
                    if (plVar37->checksum == uVar19) {
                      uVar3 = plVar37->offset;
                      if (uVar32 < uVar3) {
                        if (local_1ec < uVar28) {
                          pBVar11 = local_58;
                          pBVar23 = local_1d0;
                          if (uVar3 < uVar28) {
                            pBVar11 = local_48;
                            pBVar23 = local_50;
                          }
                          local_f0 = pBVar23 + uVar3;
                          sVar10 = ZSTD_count_2segments
                                             ((BYTE *)ip,local_f0,local_58,pBVar11,pBVar36);
                          plVar35 = local_170;
                          if (local_168 <= sVar10) {
                            pBVar11 = pBVar36;
                            if (uVar3 < uVar28) {
                              pBVar11 = local_78;
                            }
                            if (src_00 < ip) {
                              lVar29 = 0;
                              if (pBVar11 < local_f0) {
                                pBVar23 = pBVar23 + uVar3;
                                lVar29 = 0;
                                puVar31 = local_180;
                                do {
                                  pBVar23 = pBVar23 + -1;
                                  if (((BYTE)*puVar31 != *pBVar23) ||
                                     (lVar29 = lVar29 + 1, puVar31 <= src_00)) break;
                                  puVar31 = (ulong *)((long)puVar31 + -1);
                                } while (pBVar11 < pBVar23);
                              }
                            }
                            else {
                              lVar29 = 0;
                            }
                            if ((pBVar11 != local_130) && (local_f0 + -lVar29 == pBVar11)) {
                              if (local_130 < local_138) {
                                lVar21 = 0;
                                if (src_00 < (ulong *)((long)ip + -lVar29)) {
                                  puVar31 = (ulong *)(-lVar29 + (long)local_180);
                                  lVar21 = 0;
                                  pBVar23 = local_b0;
                                  do {
                                    if (((BYTE)*puVar31 != *pBVar23) ||
                                       (lVar21 = lVar21 + 1, puVar31 <= src_00)) break;
                                    puVar31 = (ulong *)((long)puVar31 + -1);
                                    bVar5 = local_130 < pBVar23;
                                    pBVar23 = pBVar23 + -1;
                                  } while (bVar5);
                                }
                              }
                              else {
                                lVar21 = 0;
                              }
                              lVar29 = lVar29 + lVar21;
                            }
LAB_00172537:
                            if (local_e8 < lVar29 + sVar10) {
                              plVar35 = local_170;
                              local_120 = lVar29;
                              local_118 = sVar10;
                              local_108 = plVar37;
                              local_e8 = lVar29 + sVar10;
                            }
                          }
                        }
                        else {
                          puVar31 = (ulong *)(local_1d0 + uVar3);
                          puVar13 = ip;
                          if (ip < puVar1) {
                            if (*puVar31 == *ip) {
                              lVar29 = 0;
                              do {
                                puVar13 = (ulong *)((long)local_88 + lVar29);
                                if (puVar1 <= puVar13) {
                                  puVar31 = (ulong *)(local_98 + lVar29 + (ulong)uVar3);
                                  goto LAB_001723a8;
                                }
                                lVar21 = lVar29 + (ulong)uVar3;
                                lVar29 = lVar29 + 8;
                              } while (*(ulong *)(local_98 + lVar21) == *puVar13);
                              uVar9 = *puVar13 ^ *(ulong *)(local_98 + lVar21);
                              uVar22 = 0;
                              if (uVar9 != 0) {
                                for (; (uVar9 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                                }
                              }
                              sVar10 = (uVar22 >> 3 & 0x1fffffff) + lVar29;
                            }
                            else {
                              uVar9 = *ip ^ *puVar31;
                              uVar22 = 0;
                              if (uVar9 != 0) {
                                for (; (uVar9 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                                }
                              }
                              sVar10 = uVar22 >> 3 & 0x1fffffff;
                            }
                          }
                          else {
LAB_001723a8:
                            if ((puVar13 < local_68) && ((int)*puVar31 == (int)*puVar13)) {
                              puVar13 = (ulong *)((long)puVar13 + 4);
                              puVar31 = (ulong *)((long)puVar31 + 4);
                            }
                            if ((puVar13 < local_70) && ((short)*puVar31 == (short)*puVar13)) {
                              puVar13 = (ulong *)((long)puVar13 + 2);
                              puVar31 = (ulong *)((long)puVar31 + 2);
                            }
                            if (puVar13 < puVar17) {
                              puVar13 = (ulong *)((long)puVar13 +
                                                 (ulong)((BYTE)*puVar31 == (BYTE)*puVar13));
                            }
                            sVar10 = (long)puVar13 - (long)ip;
                          }
                          if (local_168 <= sVar10) {
                            if ((src_00 < ip) && (uVar28 < uVar3)) {
                              lVar29 = 0;
                              puVar31 = local_180;
                              pBVar23 = local_a0 + uVar3;
                              do {
                                if (((BYTE)*puVar31 != *pBVar23) ||
                                   (lVar29 = lVar29 + 1, puVar31 <= src_00)) break;
                                puVar31 = (ulong *)((long)puVar31 + -1);
                                bVar5 = pBVar36 < pBVar23;
                                pBVar23 = pBVar23 + -1;
                              } while (bVar5);
                            }
                            else {
                              lVar29 = 0;
                            }
                            goto LAB_00172537;
                          }
                        }
                      }
                    }
                    plVar37 = plVar37 + 1;
                  } while (plVar37 < plVar35);
                  uVar9 = local_80;
                  if (local_108 == (ldmEntry_t *)0x0) goto LAB_00172659;
                  sVar10 = local_140->size;
                  if (sVar10 == local_140->capacity) {
                    return 0xffffffffffffffba;
                  }
                  prVar4 = local_140->seq;
                  UVar16 = local_108->offset;
                  prVar4[sVar10].litLength = ((int)ip - (int)local_120) - (int)src_00;
                  prVar4[sVar10].matchLength = (int)local_118 + (int)local_120;
                  prVar4[sVar10].offset = (int)local_80 - UVar16;
                  local_140->size = sVar10 + 1;
                  bVar14 = (byte)params->bucketSizeLog;
                  pBVar23 = ldmState->bucketOffsets;
                  bVar6 = pBVar23[local_110];
                  ldmState->hashTable[(local_110 << (bVar14 & 0x3f)) + (ulong)bVar6] =
                       (ldmEntry_t)(local_80 & 0xffffffff | (ulong)uVar19 << 0x20);
                  pBVar23[local_110] = ~(byte)(-1 << (bVar14 & 0x1f)) & bVar6 + 1;
                  src_00 = (ulong *)((long)ip + local_118);
                  if (local_a8 < src_00) {
                    sVar10 = local_188;
                    sequences = local_140;
                    pBVar11 = (BYTE *)((long)src_00 - local_188);
                    break;
                  }
                }
                uVar22 = local_60 + 1;
                sVar10 = local_188;
                sequences = local_140;
                pBVar11 = local_190;
              } while (uVar22 != local_f8);
            }
            pBVar11 = pBVar11 + sVar10;
          } while (pBVar11 < local_c0);
          uVar9 = (long)puVar17 - (long)src_00;
          uVar18 = local_e0;
        }
        if (0xffffffffffffff88 < uVar9) {
          return uVar9;
        }
      }
      uVar22 = sequences->size;
      if (local_b8 < uVar22) {
        pUVar2 = &sequences->seq[local_b8].litLength;
        *pUVar2 = *pUVar2 + (int)local_150;
      }
      else {
        if (uVar9 != uVar18) {
          __assert_fail("newLeftoverSize == chunkSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7e8d,
                        "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                       );
        }
        uVar9 = uVar18 + local_150;
      }
      local_148 = local_148 + 1;
    } while (local_148 != local_158);
  }
  return 0;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, 0, maxDist, ldmState->loadedDictEnd, chunkStart, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
            /* invalidate dictionaries on overflow correction */
            ldmState->loadedDictEnd = 0;
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         offset against maxDist directly.
         *
         * NOTE: Because of dictionaries + sequence splitting we MUST make sure
         * that any offset used is valid at the END of the sequence, since it may
         * be split into two sequences. This condition holds when using
         * ZSTD_window_enforceMaxDist(), but if we move to checking offsets
         * against maxDist directly, we'll have to carefully handle that case.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}